

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_test.c
# Opt level: O0

void DebugMessage(tchar_t *Msg,...)

{
  tchar_t local_428 [8];
  tchar_t Buffer [1024];
  va_list Args;
  tchar_t *Msg_local;
  
  Buffer[0x3fc] = '0';
  Buffer[0x3fd] = '\0';
  Buffer[0x3fe] = '\0';
  Buffer[0x3ff] = '\0';
  Buffer[0x3f8] = '\b';
  Buffer[0x3f9] = '\0';
  Buffer[0x3fa] = '\0';
  Buffer[0x3fb] = '\0';
  vstprintf_s(local_428,0x400,Msg,(__va_list_tag *)(Buffer + 0x3f8));
  tcscat_s(local_428,0x400,"\r\n");
  fprintf(_stderr,"%s",local_428);
  return;
}

Assistant:

void DebugMessage(const tchar_t* Msg,...)
{
    va_list Args;
    tchar_t Buffer[1024];

    va_start(Args,Msg);
    vstprintf_s(Buffer,TSIZEOF(Buffer), Msg, Args);
    va_end(Args);
    tcscat_s(Buffer,TSIZEOF(Buffer),T("\r\n"));

#ifdef UNICODE
    fprintf(stderr, "%ls", Buffer);
#else
    fprintf(stderr, "%s", Buffer);
#endif
}